

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O1

void __thiscall Am_Font_Data::Am_Font_Data(Am_Font_Data *this,Am_Font_Data *proto)

{
  size_t sVar1;
  char *__dest;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e4738;
  this->family = proto->family;
  this->bold = proto->bold;
  this->italic = proto->italic;
  this->underline = proto->underline;
  this->size = proto->size;
  if (proto->name == (char *)0x0) {
    this->name = (char *)0x0;
  }
  else {
    sVar1 = strlen(proto->name);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->name = __dest;
    strcpy(__dest,proto->name);
  }
  this->char_width = 0;
  this->main_xfont = (XFontStruct *)0x0;
  this->main_display = (Display *)0x0;
  this->font_head = (Font_Index *)0x0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Font_Data::Am_Font_Data(Am_Font_Data *proto)
{
  family = proto->family;
  bold = proto->bold;
  italic = proto->italic;
  underline = proto->underline;
  size = proto->size;
  if (proto->name) {
    name = new char[strlen(proto->name) + 1];
    strcpy(name, proto->name);
  } else
    name = nullptr;
  main_xfont = nullptr;
  main_display = nullptr;
  font_head = nullptr;
  char_width = 0;
  next = list;
  list = this;
}